

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

stbi_uc * stbi_jpeg_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  uint8 *puVar1;
  jpeg jStack_3738;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puVar1 = (uint8 *)0x0;
  }
  else {
    jStack_3738.s.img_file = (FILE *)__stream;
    puVar1 = load_jpeg_image(&jStack_3738,x,y,comp,req_comp);
    fclose(__stream);
  }
  return puVar1;
}

Assistant:

unsigned char *stbi_jpeg_load(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   FILE *f = fopen(filename, "rb");
   if (!f) return NULL;
   data = stbi_jpeg_load_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return data;
}